

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_b3cdf::ParserImpl::ParseFalseBranchStatement(ParserImpl *this)

{
  int iVar1;
  int iVar2;
  TokenDetail op;
  TokenDetail *pTVar3;
  Lexer *pLVar4;
  TokenDetail *pTVar5;
  ParseException *pPVar6;
  ParserImpl *in_RSI;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> false_branch;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> true_branch;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> exp;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> block;
  Lexer *local_68;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_60;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_58;
  undefined1 local_50 [16];
  anon_union_8_2_010d16d7_for_TokenDetail_0 aStack_40;
  String *local_38;
  int iStack_30;
  int iStack_2c;
  
  pTVar5 = &in_RSI->look_ahead_;
  if ((in_RSI->look_ahead_).token_ == 0x11e) {
    luna::Lexer::GetToken(in_RSI->lexer_,pTVar5);
  }
  if ((in_RSI->look_ahead_).token_ == 0x104) {
    NextToken(in_RSI);
    if ((in_RSI->current_).token_ != 0x104) {
      __assert_fail("current_.token_ == Token_Elseif",
                    "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                    ,0x166,
                    "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseElseIfStatement()"
                   );
    }
    iVar1 = (in_RSI->current_).line_;
    local_58.number_ = 0.0;
    local_50._8_8_ = 0.0;
    aStack_40.number_ = 0.0;
    local_38 = (String *)0x0;
    iStack_30 = 0x11e;
    op._28_4_ = iStack_2c;
    op.token_ = 0x11e;
    op.line_ = 0;
    op.column_ = 0;
    op.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
    op.module_ = (String *)0x0;
    ParseExp((ParserImpl *)local_50,
             (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)in_RSI,op,
             (int)&local_58);
    if (local_58.str_ != (String *)0x0) {
      (*((local_58.str_)->super_GCObject)._vptr_GCObject[1])();
    }
    local_58.number_ = 0.0;
    pTVar3 = NextToken(in_RSI);
    if (pTVar3->token_ != 0x111) {
      pPVar6 = (ParseException *)__cxa_allocate_exception(0x20);
      luna::ParseException::ParseException(pPVar6,"expect \'then\' for elseif",&in_RSI->current_);
      __cxa_throw(pPVar6,&luna::ParseException::typeinfo,luna::Exception::~Exception);
    }
    ParseBlock((ParserImpl *)&local_60);
    if ((in_RSI->look_ahead_).token_ == 0x11e) {
      luna::Lexer::GetToken(in_RSI->lexer_,pTVar5);
    }
    iVar2 = (in_RSI->look_ahead_).line_;
    ParseFalseBranchStatement((ParserImpl *)&local_68);
    pLVar4 = (Lexer *)operator_new(0x28);
    pLVar4->state_ = (State *)&PTR__ElseIfStatement_00188f88;
    pLVar4->module_ = (String *)local_50._0_8_;
    *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)
     &(pLVar4->in_stream_).super__Function_base._M_functor = local_60;
    *(Lexer **)((long)&(pLVar4->in_stream_).super__Function_base._M_functor + 8) = local_68;
    *(int *)&(pLVar4->in_stream_).super__Function_base._M_manager = iVar1;
    *(int *)((long)&(pLVar4->in_stream_).super__Function_base._M_manager + 4) = iVar2;
  }
  else {
    if ((in_RSI->look_ahead_).token_ == 0x11e) {
      luna::Lexer::GetToken(in_RSI->lexer_,pTVar5);
    }
    if ((in_RSI->look_ahead_).token_ != 0x103) {
      if ((in_RSI->look_ahead_).token_ == 0x11e) {
        luna::Lexer::GetToken(in_RSI->lexer_,pTVar5);
      }
      if ((in_RSI->look_ahead_).token_ == 0x105) {
        NextToken(in_RSI);
        this->lexer_ = (Lexer *)0x0;
        return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>
               )(__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>
                 )this;
      }
      pPVar6 = (ParseException *)__cxa_allocate_exception(0x20);
      luna::ParseException::ParseException(pPVar6,"expect \'end\' for if",pTVar5);
      __cxa_throw(pPVar6,&luna::ParseException::typeinfo,luna::Exception::~Exception);
    }
    NextToken(in_RSI);
    if ((in_RSI->current_).token_ != 0x103) {
      __assert_fail("current_.token_ == Token_Else",
                    "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                    ,0x189,
                    "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseElseStatement()"
                   );
    }
    ParseBlock((ParserImpl *)(local_50 + 8));
    pTVar5 = NextToken(in_RSI);
    if (pTVar5->token_ != 0x105) {
      pPVar6 = (ParseException *)__cxa_allocate_exception(0x20);
      luna::ParseException::ParseException(pPVar6,"expect \'end\' for else",&in_RSI->current_);
      __cxa_throw(pPVar6,&luna::ParseException::typeinfo,luna::Exception::~Exception);
    }
    pLVar4 = (Lexer *)operator_new(0x10);
    pLVar4->state_ = (State *)&PTR__ElseStatement_00188fc8;
    pLVar4->module_ = (String *)local_50._8_8_;
  }
  this->lexer_ = pLVar4;
  return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
         (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)this;
}

Assistant:

std::unique_ptr<SyntaxTree> ParseFalseBranchStatement()
        {
            if (LookAhead().token_ == Token_Elseif)
                return ParseElseIfStatement();
            else if (LookAhead().token_ == Token_Else)
                return ParseElseStatement();
            else if (LookAhead().token_ == Token_End)
                NextToken();            // skip 'end'
            else
                throw ParseException("expect 'end' for if", look_ahead_);

            return std::unique_ptr<SyntaxTree>();
        }